

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  long lVar1;
  MemPage *pMVar2;
  bool bVar3;
  Pgno PVar4;
  u32 uVar5;
  u32 uVar6;
  u32 uVar7;
  int iVar8;
  uint in_ECX;
  uint uVar9;
  u32 *in_RDX;
  undefined8 *in_RSI;
  BtShared *in_RDI;
  char in_R8B;
  long in_FS_OFFSET;
  int bNoContent;
  int noContent;
  int d2;
  int dist;
  u32 i;
  uchar *aData;
  Pgno iPage;
  u32 closest;
  Pgno iNewTrunk;
  u32 nSearch;
  u8 searchList;
  Pgno iTrunk;
  Pgno mxPage;
  MemPage *pPrevTrunk;
  u32 k;
  u32 n;
  int rc;
  MemPage *pPage1;
  MemPage *pPg;
  MemPage *pNewTrunk;
  u8 eType;
  MemPage *pTrunk;
  undefined4 in_stack_ffffffffffffff48;
  u32 in_stack_ffffffffffffff4c;
  Pgno in_stack_ffffffffffffff54;
  uint in_stack_ffffffffffffff58;
  Pgno in_stack_ffffffffffffff5c;
  Pgno in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  u8 *in_stack_ffffffffffffff68;
  undefined4 *puVar10;
  Pgno in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  uint uVar11;
  undefined4 in_stack_ffffffffffffff7c;
  uint local_80;
  bool local_79;
  int local_5c;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pMVar2 = in_RDI->pPage1;
  PVar4 = btreePagecount(in_RDI);
  uVar5 = sqlite3Get4byte(pMVar2->aData + 0x24);
  if (PVar4 <= uVar5) {
    local_2c = sqlite3CorruptError(0);
    goto LAB_0016e202;
  }
  if (uVar5 == 0) {
    uVar9 = (uint)(in_RDI->bDoTruncate == '\0');
    local_2c = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff4c,
                                                   in_stack_ffffffffffffff48));
    if (local_2c != 0) goto LAB_0016e202;
    in_RDI->nPage = in_RDI->nPage + 1;
    if (in_RDI->nPage == (uint)sqlite3PendingByte / in_RDI->pageSize + 1) {
      in_RDI->nPage = in_RDI->nPage + 1;
    }
    if ((in_RDI->autoVacuum != '\0') &&
       (PVar4 = ptrmapPageno(in_RDI,in_RDI->nPage), PVar4 == in_RDI->nPage)) {
      local_5c = btreeGetUnusedPage((BtShared *)
                                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                    uVar9,(MemPage **)
                                          CONCAT44(in_stack_ffffffffffffff4c,
                                                   in_stack_ffffffffffffff48),0);
      if (local_5c == 0) {
        local_5c = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff4c,
                                                       in_stack_ffffffffffffff48));
        releasePage((MemPage *)0x16e0d2);
      }
      if (local_5c != 0) {
        local_2c = local_5c;
        goto LAB_0016e202;
      }
      in_RDI->nPage = in_RDI->nPage + 1;
      in_stack_ffffffffffffff4c = in_RDI->nPage;
      if (in_stack_ffffffffffffff4c == (uint)sqlite3PendingByte / in_RDI->pageSize + 1) {
        in_RDI->nPage = in_RDI->nPage + 1;
      }
    }
    sqlite3Put4byte(in_RDI->pPage1->aData + 0x1c,in_RDI->nPage);
    *in_RDX = in_RDI->nPage;
    local_2c = btreeGetUnusedPage((BtShared *)
                                  CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                  uVar9,(MemPage **)
                                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                ),0);
    if (local_2c != 0) goto LAB_0016e202;
    local_5c = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff4c,
                                                   in_stack_ffffffffffffff48));
    if (local_5c != 0) {
      releasePage((MemPage *)0x16e1d0);
      *in_RSI = 0;
    }
  }
  else {
    local_80 = 0;
    if (in_R8B == '\x01') {
      if ((in_ECX <= PVar4) &&
         (local_2c = ptrmapGet((BtShared *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                               in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,
                               (Pgno *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                              ), local_2c != 0)) goto LAB_0016e202;
      local_79 = false;
    }
    else {
      local_79 = in_R8B == '\x02';
    }
    local_2c = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff4c,
                                                   in_stack_ffffffffffffff48));
    if (local_2c != 0) goto LAB_0016e202;
    sqlite3Put4byte(pMVar2->aData + 0x24,uVar5 - 1);
    do {
      uVar7 = sqlite3Get4byte(pMVar2->aData + 0x20);
      if ((PVar4 < uVar7) ||
         (uVar9 = local_80 + 1, bVar3 = uVar5 < local_80, local_80 = uVar9, bVar3)) {
        local_5c = sqlite3CorruptError(0);
      }
      else {
        local_5c = btreeGetUnusedPage((BtShared *)
                                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                      in_stack_ffffffffffffff54,
                                      (MemPage **)
                                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                      0);
      }
      if (local_5c != 0) break;
      uVar6 = sqlite3Get4byte((u8 *)(puRam0000000000000050 + 1));
      if ((uVar6 != 0) || (local_79)) {
        if ((in_RDI->usableSize >> 2) - 2 < uVar6) {
          local_5c = sqlite3CorruptError(0);
          break;
        }
        if ((local_79) && ((in_ECX == uVar7 || ((uVar7 < in_ECX && (in_R8B == '\x02')))))) {
          *in_RDX = uVar7;
          *in_RSI = 0;
          local_79 = false;
          local_5c = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff4c,
                                                         in_stack_ffffffffffffff48));
          if (local_5c != 0) break;
          if (uVar6 == 0) {
            *(undefined4 *)(pMVar2->aData + 0x20) = *puRam0000000000000050;
          }
          else {
            uVar7 = sqlite3Get4byte((u8 *)(puRam0000000000000050 + 2));
            if (PVar4 < uVar7) {
              local_5c = sqlite3CorruptError(0);
              break;
            }
            local_5c = btreeGetUnusedPage((BtShared *)
                                          CONCAT44(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58),
                                          in_stack_ffffffffffffff54,
                                          (MemPage **)
                                          CONCAT44(in_stack_ffffffffffffff4c,
                                                   in_stack_ffffffffffffff48),0);
            if (local_5c != 0) break;
            local_5c = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff4c,
                                                           in_stack_ffffffffffffff48));
            if (local_5c != 0) {
              releasePage((MemPage *)0x16dbd3);
              break;
            }
            *_DAT_aaaaaaaaaaaaaafa = *puRam0000000000000050;
            sqlite3Put4byte((uchar *)(_DAT_aaaaaaaaaaaaaafa + 1),uVar6 - 1);
            memcpy(_DAT_aaaaaaaaaaaaaafa + 2,puRam0000000000000050 + 3,(ulong)((uVar6 - 1) * 4));
            releasePage((MemPage *)0x16dc50);
            sqlite3Put4byte(pMVar2->aData + 0x20,uVar7);
          }
        }
        else if (uVar6 != 0) {
          puVar10 = puRam0000000000000050;
          if (in_ECX == 0) {
            uVar9 = 0;
          }
          else {
            uVar11 = 0;
            if (in_R8B == '\x02') {
              in_stack_ffffffffffffff64 = 0;
              while ((uVar9 = uVar11, in_stack_ffffffffffffff64 < uVar6 &&
                     (uVar7 = sqlite3Get4byte((u8 *)((long)puVar10 +
                                                    (ulong)(in_stack_ffffffffffffff64 * 4 + 8))),
                     uVar9 = in_stack_ffffffffffffff64, in_ECX < uVar7))) {
                in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + 1;
              }
            }
            else {
              uVar7 = sqlite3Get4byte((u8 *)(puRam0000000000000050 + 2));
              in_stack_ffffffffffffff60 = sqlite3AbsInt32(uVar7 - in_ECX);
              for (in_stack_ffffffffffffff64 = 1; uVar9 = uVar11, in_stack_ffffffffffffff64 < uVar6;
                  in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + 1) {
                uVar7 = sqlite3Get4byte((u8 *)((long)puVar10 +
                                              (ulong)(in_stack_ffffffffffffff64 * 4 + 8)));
                in_stack_ffffffffffffff5c = sqlite3AbsInt32(uVar7 - in_ECX);
                if ((int)in_stack_ffffffffffffff5c < (int)in_stack_ffffffffffffff60) {
                  in_stack_ffffffffffffff60 = in_stack_ffffffffffffff5c;
                  uVar11 = in_stack_ffffffffffffff64;
                }
              }
            }
          }
          uVar7 = sqlite3Get4byte((u8 *)((long)puVar10 + (ulong)(uVar9 * 4 + 8)));
          if ((PVar4 < uVar7) || (uVar7 < 2)) {
            local_5c = sqlite3CorruptError(0);
            break;
          }
          if (((!local_79) || (uVar7 == in_ECX)) || ((uVar7 < in_ECX && (in_R8B == '\x02')))) {
            *in_RDX = uVar7;
            local_5c = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff4c,
                                                           in_stack_ffffffffffffff48));
            if (local_5c != 0) break;
            if (uVar9 < uVar6 - 1) {
              *(undefined4 *)((long)puVar10 + (ulong)(uVar9 * 4 + 8)) =
                   *(undefined4 *)((long)puVar10 + (ulong)(uVar6 * 4 + 4));
            }
            sqlite3Put4byte((uchar *)(puVar10 + 1),uVar6 - 1);
            iVar8 = btreeGetHasContent((BtShared *)
                                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                                       ,in_stack_ffffffffffffff5c);
            in_stack_ffffffffffffff58 = (uint)(iVar8 == 0);
            local_5c = btreeGetUnusedPage((BtShared *)
                                          CONCAT44(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58),
                                          in_stack_ffffffffffffff54,
                                          (MemPage **)
                                          CONCAT44(in_stack_ffffffffffffff4c,
                                                   in_stack_ffffffffffffff48),0);
            if ((local_5c == 0) &&
               (local_5c = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff4c,
                                                               in_stack_ffffffffffffff48)),
               local_5c != 0)) {
              releasePage((MemPage *)0x16df5c);
              *in_RSI = 0;
            }
            local_79 = false;
          }
        }
      }
      else {
        local_5c = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff4c,
                                                       in_stack_ffffffffffffff48));
        if (local_5c != 0) break;
        *in_RDX = uVar7;
        *(undefined4 *)(pMVar2->aData + 0x20) = *puRam0000000000000050;
        *in_RSI = 0;
      }
      releasePage((MemPage *)0x16df81);
    } while (local_79);
  }
  releasePage((MemPage *)0x16e1ed);
  releasePage((MemPage *)0x16e1f7);
  local_2c = local_5c;
LAB_0016e202:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-21003-45125 The 4-byte big-endian integer at offset 36
  ** stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    u32 nSearch = 0;   /* Count of the number of search attempts */

    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage || nSearch++ > n ){
        rc = SQLITE_CORRUPT_PGNO(pPrevTrunk ? pPrevTrunk->pgno : 1);
      }else{
        rc = btreeGetUnusedPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched.
        ** So extract the trunk page itself and use it as the newly
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %u trunk - %u free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_PGNO(iTrunk);
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE))
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){
            rc = SQLITE_CORRUPT_PGNO(iTrunk);
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetUnusedPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %u trunk - %u free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage || iPage<2 ){
          rc = SQLITE_CORRUPT_PGNO(iTrunk);
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE))
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %u was leaf %u of %u on trunk %u"
                 ": %u more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
              *ppPage = 0;
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %u from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetUnusedPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
      *ppPage = 0;
    }
    TRACE(("ALLOCATE: %u from end of file\n", *pPgno));
  }

  assert( CORRUPT_DB || *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  assert( rc!=SQLITE_OK || sqlite3PagerPageRefcount((*ppPage)->pDbPage)<=1 );
  assert( rc!=SQLITE_OK || (*ppPage)->isInit==0 );
  return rc;
}